

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

void __thiscall testing::internal::DeathTestImpl::ReadAndInterpretStatusByte(DeathTestImpl *this)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  ostream *poVar5;
  size_t sVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  uint uVar8;
  char flag;
  Message error;
  char buffer [256];
  byte local_221;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  int local_1dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  string local_138 [8];
  
  do {
    sVar2 = read(this->read_fd_,&local_221,1);
    iVar1 = (int)sVar2;
    if (iVar1 != -1) {
      if (iVar1 == 0) {
        this->outcome_ = DIED;
        goto LAB_0010a75e;
      }
      if (iVar1 == 1) {
        if (local_221 < 0x52) {
          if (local_221 == 0x49) {
            iVar1 = this->read_fd_;
            Message::Message((Message *)&local_1b8);
            do {
              while( true ) {
                sVar2 = read(iVar1,local_138,0xff);
                uVar8 = (uint)sVar2;
                if ((int)uVar8 < 1) break;
                *(undefined1 *)((long)&local_138[0]._M_dataplus._M_p + (ulong)(uVar8 & 0x7fffffff))
                     = 0;
                sVar6 = strlen((char *)local_138);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_1b8._M_dataplus._M_p + 0x10),(char *)local_138,sVar6);
              }
            } while ((uVar8 == 0xffffffff) && (piVar3 = __errno_location(), *piVar3 == 4));
            if (uVar8 == 0) {
              GTestLog::GTestLog((GTestLog *)&local_200,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/VgTajdd[P]plugin_manager/build_O1/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                                 ,0x16d);
              StringStreamToString(&local_220,(stringstream *)local_1b8._M_dataplus._M_p);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,local_220._M_dataplus._M_p,local_220._M_string_length
                        );
            }
            else {
              piVar3 = __errno_location();
              iVar1 = *piVar3;
              GTestLog::GTestLog((GTestLog *)&local_200,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/VgTajdd[P]plugin_manager/build_O1/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                                 ,0x170);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Error while reading death test internal: ",0x29);
              GetLastErrnoDescription_abi_cxx11_();
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,local_220._M_dataplus._M_p,
                                  local_220._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5," [",2);
              poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != &local_220.field_2) {
              operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1
                             );
            }
            GTestLog::~GTestLog((GTestLog *)&local_200);
            if ((stringstream *)local_1b8._M_dataplus._M_p != (stringstream *)0x0) {
              (**(code **)(*(long *)local_1b8._M_dataplus._M_p + 8))(local_1b8._M_dataplus._M_p);
            }
            goto LAB_0010a75e;
          }
          if (local_221 == 0x4c) {
            this->outcome_ = LIVED;
            goto LAB_0010a75e;
          }
        }
        else {
          if (local_221 == 0x54) {
            this->outcome_ = THREW;
            goto LAB_0010a75e;
          }
          if (local_221 == 0x52) {
            this->outcome_ = RETURNED;
            goto LAB_0010a75e;
          }
        }
        GTestLog::GTestLog((GTestLog *)local_138,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/VgTajdd[P]plugin_manager/build_O1/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                           ,0x1f1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Death test child process reported ",0x22);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"unexpected status byte (",0x18);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
        GTestLog::~GTestLog((GTestLog *)local_138);
        goto LAB_0010a75e;
      }
      break;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  GTestLog::GTestLog((GTestLog *)&local_220,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/VgTajdd[P]plugin_manager/build_O1/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                     ,0x1f6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Read from death test child process failed: ",0x2b);
  GetLastErrnoDescription_abi_cxx11_();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,local_138[0]._M_dataplus._M_p,local_138[0]._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
    operator_delete(local_138[0]._M_dataplus._M_p,local_138[0].field_2._M_allocated_capacity + 1);
  }
  GTestLog::~GTestLog((GTestLog *)&local_220);
LAB_0010a75e:
  do {
    iVar1 = close(this->read_fd_);
    if (iVar1 != -1) {
      this->read_fd_ = -1;
      return;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"CHECK failed: File ","");
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_178,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/VgTajdd[P]plugin_manager/build_O1/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                     );
  local_198._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar7 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p == paVar7) {
    local_198.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_198.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  }
  else {
    local_198.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  local_198._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_198,", line ");
  local_1d8._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar7 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p == paVar7) {
    local_1d8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_1d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  }
  else {
    local_1d8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  local_1d8._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  local_1dc = 0x1f9;
  StreamableToString<int>(&local_158,&local_1dc);
  std::operator+(&local_200,&local_1d8,&local_158);
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_200,": ");
  local_1b8._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar7 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p == paVar7) {
    local_1b8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_1b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  }
  else {
    local_1b8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  local_1b8._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_1b8,"posix::Close(read_fd())");
  local_220._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar7 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p == paVar7) {
    local_220.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_220.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  }
  else {
    local_220.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  local_220._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_220," != -1");
  local_138[0]._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar7 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138[0]._M_dataplus._M_p == paVar7) {
    local_138[0].field_2._0_8_ = paVar7->_M_allocated_capacity;
    local_138[0].field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_138[0]._M_dataplus._M_p = (pointer)&local_138[0].field_2;
  }
  else {
    local_138[0].field_2._0_8_ = paVar7->_M_allocated_capacity;
  }
  local_138[0]._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  DeathTestAbort(local_138);
}

Assistant:

void DeathTestImpl::ReadAndInterpretStatusByte() {
  char flag;
  int bytes_read;

  // The read() here blocks until data is available (signifying the
  // failure of the death test) or until the pipe is closed (signifying
  // its success), so it's okay to call this in the parent before
  // the child process has exited.
  do {
    bytes_read = posix::Read(read_fd(), &flag, 1);
  } while (bytes_read == -1 && errno == EINTR);

  if (bytes_read == 0) {
    set_outcome(DIED);
  } else if (bytes_read == 1) {
    switch (flag) {
      case kDeathTestReturned:
        set_outcome(RETURNED);
        break;
      case kDeathTestThrew:
        set_outcome(THREW);
        break;
      case kDeathTestLived:
        set_outcome(LIVED);
        break;
      case kDeathTestInternalError:
        FailFromInternalError(read_fd());  // Does not return.
        break;
      default:
        GTEST_LOG_(FATAL) << "Death test child process reported "
                          << "unexpected status byte ("
                          << static_cast<unsigned int>(flag) << ")";
    }
  } else {
    GTEST_LOG_(FATAL) << "Read from death test child process failed: "
                      << GetLastErrnoDescription();
  }
  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Close(read_fd()));
  set_read_fd(-1);
}